

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_2,_4> *
tcu::operator/(Matrix<float,_2,_4> *__return_storage_ptr__,Matrix<float,_2,_4> *mtx,float scalar)

{
  int col;
  long lVar1;
  Vector<float,_2> *pVVar2;
  int row;
  long lVar3;
  
  Matrix<float,_2,_4>::Matrix(__return_storage_ptr__);
  pVVar2 = (Vector<float,_2> *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      ((Vector<tcu::Vector<float,_2>,_4> *)pVVar2->m_data)->m_data[0].m_data[lVar3] =
           ((Vector<tcu::Vector<float,_2>,_4> *)((Vector<float,_2> *)mtx)->m_data)->m_data[0].m_data
           [lVar3] / scalar;
    }
    pVVar2 = pVVar2 + 1;
    mtx = (Matrix<float,_2,_4> *)((long)mtx + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator/ (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) / scalar;
	return res;
}